

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::QuadO2::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,QuadO2 *this,RefinementPattern *ref_pat,dim_t codim)

{
  char *pcVar1;
  uint uVar2;
  ulong cols;
  double *pdVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  tuple<lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_> tVar7;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  ulong uVar11;
  PointerType pdVar12;
  long lVar13;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *childGeoPtrs;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  childPolygons;
  MatrixXd locChildPolygonCoords;
  MatrixXd locChildCoords_2;
  MatrixXd locChildCoords_1;
  stringstream ss;
  MatrixXd locChildCoords;
  scalar_quotient_op<double,_double> local_811;
  QuadO2 *local_810;
  undefined1 local_808 [160];
  undefined1 local_768 [64];
  PointerType local_728;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_6c0;
  void *local_6a8;
  Index IStack_6a0;
  long local_698;
  ulong local_690;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_688;
  undefined **local_668;
  pointer local_660;
  ulong local_658;
  ulong local_650;
  double local_648;
  undefined1 local_640 [64];
  PointerType local_600;
  scalar_constant_op<double> local_5a0;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_598;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_558;
  undefined1 local_538 [24];
  scalar_constant_op<double> local_520;
  XprTypeNested local_518;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_3b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_378;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_300;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_288;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_250;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_218;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_188;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_110;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_d8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_a0;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  local_810 = this;
  if ((ref_pat->ref_el_).type_ != kQuad) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_538);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_538 + 0x10),"Refinement pattern for ",0x17);
    local_808[0] = (ref_pat->ref_el_).type_;
    base::RefEl::ToString_abi_cxx11_((string *)local_768,(RefEl *)local_808);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_538 + 0x10),(char *)local_768._0_8_,local_768._8_8_);
    pcVar1 = local_768 + 0x10;
    if ((char *)local_768._0_8_ != pcVar1) {
      operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
    }
    local_768._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_768,"ref_pat.RefEl() == lf::base::RefEl::kQuad()","");
    local_808._0_8_ = (long)local_808 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_768,(string *)local_808,0xbb,(string *)local_640);
    if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
      operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
    }
    if (local_808._0_8_ != (long)local_808 + 0x10) {
      operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
    }
    if ((char *)local_768._0_8_ != pcVar1) {
      operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_538);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_538 + 0x10),"Illegal codim ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_538 + 0x10));
    local_768._0_8_ = local_768 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"codim < 3","");
    local_808._0_8_ = (long)local_808 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_768,(string *)local_808,0xbc,(string *)local_640);
    if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
      operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
    }
    if (local_808._0_8_ != (long)local_808 + 0x10) {
      operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
    }
    if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
      operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = ref_pat->lattice_const_;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*ref_pat->_vptr_RefinementPattern[1])(&local_6c0,ref_pat,(ulong)codim);
  lVar13 = (long)local_6c0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_6c0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)codim);
  local_650 = (lVar13 >> 3) * -0x5555555555555555;
  if (iVar6 != (int)local_650) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_538);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_538 + 0x10),"NumChildren ",0xc);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_538 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," <-> ",5);
    (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)codim);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    local_768._0_8_ = local_768 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_768,"noChildren == ref_pat.NumChildren(codim)","");
    local_808._0_8_ = (long)local_808 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_768,(string *)local_808,200,(string *)local_640);
    if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
      operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
    }
    if (local_808._0_8_ != (long)local_808 + 0x10) {
      operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
    }
    if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
      operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_650 = local_650 & 0xffffffff;
  if (local_650 != 0) {
    local_660 = (pointer)(1.0 / (double)uVar2);
    local_658 = (ulong)(3 - codim);
    uVar11 = 0;
    local_668 = &PTR_DimLocal_0030e9a8;
    do {
      if (local_6c0.
          super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_538 + 0x10),"childPolygons[child].rows() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_538 + 0x10));
        local_768._0_8_ = local_768 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_768,"childPolygons[child].rows() == 2","");
        local_808._0_8_ = (long)local_808 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_808,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_768,(string *)local_808,0xd2,(string *)local_640);
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        if (local_808._0_8_ != (long)local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
          operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cols = *(Index *)((long)(local_6c0.
                               super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0x10);
      local_690 = uVar11;
      if (cols != 4 && cols != local_658) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_538 + 0x10),"childPolygons[child].cols() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_538 + 0x10));
        local_768._0_8_ = local_768 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_768,
                   "(childPolygons[child].cols() == (3 - codim)) || (childPolygons[child].cols() == 4)"
                   ,"");
        local_808._0_8_ = (long)local_808 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_808,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_768,(string *)local_808,0xd6,(string *)local_640);
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        if (local_808._0_8_ != (long)local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
          operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_640._0_8_ = local_660;
      local_808._0_8_ =
           local_6c0.
           super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar11;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_768,2,cols,(scalar_constant_op<double> *)local_640);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                       *)local_538,(Lhs *)local_768,(Rhs *)local_808,
                      (scalar_product_op<double,_double> *)&local_300);
      local_6a8 = (void *)0x0;
      IStack_6a0 = 0;
      local_698 = 0;
      local_648 = local_520.m_other;
      pdVar3 = (local_518->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>,double,double>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                  *)local_538,(assign_op<double,_double> *)local_768);
      if (0 < local_698 * IStack_6a0) {
        lVar13 = 0;
        do {
          *(double *)((long)local_6a8 + lVar13 * 8) =
               (double)*(int *)((long)pdVar3 + lVar13 * 4) * local_648;
          lVar13 = lVar13 + 1;
        } while (local_698 * IStack_6a0 - lVar13 != 0);
      }
      if (codim == 0) {
        lVar13 = local_6c0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
        if (lVar13 == 4) {
          local_688.m_storage.m_data = (double *)0x0;
          local_688.m_storage.m_rows = 0;
          local_688.m_storage.m_cols = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    (&local_688,IStack_6a0,8);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_558,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&local_688,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_6a8);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_250,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,0);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_68,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,1);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_300,&local_250,&local_68,(scalar_sum_op<double,_double> *)local_768
                         );
          local_808._0_8_ = &DAT_4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_768,
                           local_300.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,(scalar_constant_op<double> *)local_808);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_538,&local_300,(Rhs *)local_768,
                          (scalar_quotient_op<double,_double> *)local_640);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_558,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_538);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_288,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,1);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_a0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,2);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_218,&local_288,&local_a0,(scalar_sum_op<double,_double> *)local_808
                         );
          local_640._0_8_ = &DAT_4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_808,
                           local_218.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,(scalar_constant_op<double> *)local_640);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_768,&local_218,(Rhs *)local_808,
                          (scalar_quotient_op<double,_double> *)&local_378);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar8,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_768);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_3b0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,2);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_d8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,3);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_378,&local_3b0,&local_d8,(scalar_sum_op<double,_double> *)local_640
                         );
          local_188.m_lhs.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_data = (PointerType)0x4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_640,
                           local_378.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,(scalar_constant_op<double> *)&local_188);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_808,&local_378,(Rhs *)local_640,
                          (scalar_quotient_op<double,_double> *)&local_598);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar8,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_808);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_598,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,3);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_110,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,0);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_188,&local_598,&local_110,
                          (scalar_sum_op<double,_double> *)&local_1a0);
          local_5a0.m_other = 2.0;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp(&local_1a0,
                           local_188.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,&local_5a0);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_640,&local_188,&local_1a0,&local_811);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)local_640);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_558);
          (*(local_810->super_Geometry)._vptr_Geometry[3])(local_538,local_810,&local_688);
          std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_808);
          local_768._0_8_ = local_808._0_8_;
          local_808._0_8_ =
               (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                )0x0;
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
          ::
          emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                    ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                      *)local_768);
          if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
               )local_768._0_8_ != (Geometry *)0x0) {
            (**(code **)(*(long *)local_768._0_8_ + 0x58))();
          }
          local_768._0_8_ = (char *)0x0;
          if ((__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              )local_808._0_8_ !=
              (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              )0x0) {
            (**(code **)(*(long *)local_808._0_8_ + 0x58))();
          }
          local_808._0_8_ =
               (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                )0x0;
          free((void *)local_538._0_8_);
          pdVar12 = local_688.m_storage.m_data;
        }
        else {
          if (lVar13 != 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_538);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_538 + 0x10),"childPolygons[",0xe);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_538 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"].cols() = ",0xb);
            std::ostream::_M_insert<long>((long)poVar9);
            local_768._0_8_ = local_768 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"false","");
            local_808._0_8_ = (long)local_808 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_808,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            base::AssertionFailed((string *)local_768,(string *)local_808,0xfb,(string *)local_640);
            if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
              operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
            }
            if (local_808._0_8_ != (long)local_808 + 0x10) {
              operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
            }
            if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
              operator_delete((void *)local_768._0_8_,local_768._16_8_ + 1);
            }
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"this code should not be reached");
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_598.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_data = (double *)0x0;
          local_598.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_rows.m_value = 0;
          local_598.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          ._16_8_ = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_598,
                     IStack_6a0,6);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3b0,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&local_598,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_6a8);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_378.m_lhs,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,0);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_188.m_lhs,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,1);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                           *)local_640,&local_378.m_lhs,&local_188.m_lhs,
                          (scalar_sum_op<double,_double> *)local_768);
          local_808._0_8_ = &DAT_4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_768,(Index)local_600,1,(scalar_constant_op<double> *)local_808);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_538,(Lhs *)local_640,(Rhs *)local_768,
                          (scalar_quotient_op<double,_double> *)&local_300);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3b0,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_538);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_250,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,1);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_68,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,2);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_300,&local_250,&local_68,(scalar_sum_op<double,_double> *)local_808
                         );
          local_218.m_lhs.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_data = (PointerType)0x4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_808,
                           local_300.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,(scalar_constant_op<double> *)&local_218);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_768,&local_300,(Rhs *)local_808,
                          (scalar_quotient_op<double,_double> *)&local_288);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar8,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_768);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_288,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,2);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_a0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,0);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp(&local_218,&local_288,&local_a0,(scalar_sum_op<double,_double> *)&local_d8
                         );
          local_110.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_data = (PointerType)0x4000000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)&local_d8,
                           local_218.m_rhs.
                           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                           .m_rows.m_value,1,(scalar_constant_op<double> *)&local_110);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_808,&local_218,(Rhs *)&local_d8,
                          (scalar_quotient_op<double,_double> *)&local_558);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)local_808);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_3b0);
          (*(local_810->super_Geometry)._vptr_Geometry[3])(local_538,local_810,&local_598);
          std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_808);
          local_768._0_8_ = local_808._0_8_;
          local_808._0_8_ =
               (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                )0x0;
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
          ::
          emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                    ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                      *)local_768);
          if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
               )local_768._0_8_ != (Geometry *)0x0) {
            (**(code **)(*(long *)local_768._0_8_ + 0x58))();
          }
          local_768._0_8_ = (char *)0x0;
          if ((__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              )local_808._0_8_ !=
              (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              )0x0) {
            (**(code **)(*(long *)local_808._0_8_ + 0x58))();
          }
          local_808._0_8_ =
               (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                )0x0;
          free((void *)local_538._0_8_);
          pdVar12 = local_598.
                    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_data;
        }
      }
      else if (codim == 1) {
        local_378.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data = (double *)0x0;
        local_378.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_rows.m_value = 0;
        local_378.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        _16_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_378,
                   IStack_6a0,3);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_300,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_378,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_6a8);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_808,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,0);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_640,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_6a8,1);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)local_768,
                        (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                        local_808,(Rhs *)local_640,(scalar_sum_op<double,_double> *)&local_218);
        local_188.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data = (PointerType)0x4000000000000000;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)&local_218,(Index)local_728,1,(scalar_constant_op<double> *)&local_188);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_538,(Lhs *)local_768,(Rhs *)&local_218,
                        (scalar_quotient_op<double,_double> *)&local_250);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_300,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)local_538);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                  ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_300);
        (*(local_810->super_Geometry)._vptr_Geometry[3])(local_538,local_810,&local_378);
        tVar7.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
              )operator_new(0x60);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_768,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538);
        SegmentO2::SegmentO2
                  ((SegmentO2 *)
                   tVar7.
                   super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                   .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl,
                   (Matrix<double,__1,_3,_0,__1,_3> *)local_768);
        free((void *)local_768._0_8_);
        local_808._0_8_ =
             tVar7.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_808);
        if ((__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
            local_808._0_8_ !=
            (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
            0x0) {
          (**(code **)(*(long *)local_808._0_8_ + 0x58))();
        }
        local_808._0_8_ =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             0x0;
        free((void *)local_538._0_8_);
        pdVar12 = local_378.m_lhs.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
      }
      else {
        (*(local_810->super_Geometry)._vptr_Geometry[3])
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538,local_810,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_6a8);
        tVar7.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
              )operator_new(0x18);
        local_768._0_8_ = (char *)0x0;
        local_768._8_8_ = (PointerType)0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_768,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538);
        uVar5 = local_538._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_768,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_538,
                   (assign_op<double,_double> *)local_640);
        pdVar12 = (PointerType)
                  (local_768._8_8_ - ((long)local_768._8_8_ >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)local_768._8_8_) {
          lVar13 = 0;
          do {
            pdVar3 = (double *)(uVar5 + lVar13 * 8);
            dVar4 = pdVar3[1];
            *(double *)(local_768._0_8_ + lVar13 * 8) = *pdVar3;
            ((double *)(local_768._0_8_ + lVar13 * 8))[1] = dVar4;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)pdVar12);
        }
        if ((long)pdVar12 < (long)local_768._8_8_) {
          do {
            *(double *)(local_768._0_8_ + (long)pdVar12 * 8) = *(double *)(uVar5 + pdVar12 * 8);
            pdVar12 = (PointerType)((long)pdVar12 + 1);
          } while ((PointerType)local_768._8_8_ != pdVar12);
        }
        *(undefined ***)
         tVar7.
         super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
         .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl = local_668;
        *(undefined8 *)
         ((long)tVar7.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 8) =
             local_768._0_8_;
        *(undefined8 *)
         ((long)tVar7.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 0x10) =
             local_768._8_8_;
        local_808._0_8_ =
             tVar7.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_808);
        if ((__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
            local_808._0_8_ !=
            (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
            0x0) {
          (**(code **)(*(long *)local_808._0_8_ + 0x58))();
        }
        local_808._0_8_ =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             0x0;
        pdVar12 = (PointerType)local_538._0_8_;
      }
      free(pdVar12);
      free(local_6a8);
      uVar11 = local_690 + 1;
    } while (uVar11 != local_650);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_6c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> QuadO2::ChildGeometry(
    const RefinementPattern& ref_pat, lf::base::dim_t codim) const {
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kQuad(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  const double hLattice = 1. / static_cast<double>(ref_pat.LatticeConst());
  std::vector<std::unique_ptr<Geometry>> childGeoPtrs = {};

  // get coordinates of childGeometries
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>> childPolygons(
      ref_pat.ChildPolygons(codim));

  const base::size_type noChildren = childPolygons.size();
  LF_VERIFY_MSG(
      noChildren == ref_pat.NumChildren(codim),
      "NumChildren " << noChildren << " <-> " << ref_pat.NumChildren(codim));

  // create a geometry object for each child
  for (size_t child = 0; child < noChildren; ++child) {
    // codim == 0: a child triangle/quadrilateral is described by a lattice
    // polygon with six/eight vertices
    // codim == 1: a child segment is described by a polygon with three vertices
    // codim == 2: a child point by a single point ("polygon with one corner")
    LF_VERIFY_MSG(
        childPolygons[child].rows() == 2,
        "childPolygons[child].rows() = " << childPolygons[child].rows());
    LF_VERIFY_MSG(
        (childPolygons[child].cols() == (3 - codim)) ||
            (childPolygons[child].cols() == 4),
        "childPolygons[child].cols() = " << childPolygons[child].cols());

    const Eigen::MatrixXd locChildPolygonCoords(
        hLattice * childPolygons[child].cast<double>());

    switch (codim) {
      case 0: {
        if (childPolygons[child].cols() == 3) {
          Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 6);
          locChildCoords << locChildPolygonCoords,
              (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) /
                  2.,
              (locChildPolygonCoords.col(1) + locChildPolygonCoords.col(2)) /
                  2.,
              (locChildPolygonCoords.col(2) + locChildPolygonCoords.col(0)) /
                  2.;

          childGeoPtrs.push_back(
              std::make_unique<TriaO2>(Global(locChildCoords)));

        } else if (childPolygons[child].cols() == 4) {
          Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 8);
          locChildCoords << locChildPolygonCoords,
              (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) /
                  2.,
              (locChildPolygonCoords.col(1) + locChildPolygonCoords.col(2)) /
                  2.,
              (locChildPolygonCoords.col(2) + locChildPolygonCoords.col(3)) /
                  2.,
              (locChildPolygonCoords.col(3) + locChildPolygonCoords.col(0)) /
                  2.;

          childGeoPtrs.push_back(
              std::make_unique<QuadO2>(Global(locChildCoords)));

        } else {
          LF_VERIFY_MSG(false, "childPolygons[" << child << "].cols() = "
                                                << childPolygons[child].cols());
        }

        break;
      }
      case 1: {
        Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 3);
        locChildCoords << locChildPolygonCoords,
            (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) / 2.;

        childGeoPtrs.push_back(
            std::make_unique<SegmentO2>(Global(locChildCoords)));

        break;
      }
      case 2: {
        childGeoPtrs.push_back(
            std::make_unique<Point>(Global(locChildPolygonCoords)));

        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
      }
    }
  }

  return childGeoPtrs;
}